

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

panel * get_panel_midleft(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  panel *p;
  byte attr;
  undefined1 *puVar3;
  
  p = panel_allocate(L'\t');
  wVar1 = weight_remaining(player);
  attr = (byte)((uint)wVar1 >> 0x1f) ^ 0xd;
  panel_line(p,(player->max_lev <= player->lev) * '\x02' + '\v',"Level","%d");
  panel_line(p,(player->max_exp <= player->exp) * '\x02' + '\v',"Cur Exp","%d");
  panel_line(p,'\r',"Max Exp","%d",(ulong)(uint)player->max_exp);
  if ((long)player->lev < 0x32) {
    puVar3 = show_adv_exp_buffer;
    strnfmt(show_adv_exp_buffer,0x1e,"%ld",
            (long)((int)((uint)player->expfact * *(int *)(&DAT_0025f2bc + (long)player->lev * 4)) /
                  100));
  }
  else {
    puVar3 = "********";
  }
  panel_line(p,'\r',"Adv Exp","%s",puVar3);
  panel_space(p);
  panel_line(p,'\r',"Gold","%d",(ulong)(uint)player->au);
  panel_line(p,attr,"Burden","%.1f lb",(double)((float)player->upkeep->total_weight / 10.0));
  wVar2 = -wVar1;
  if (L'\0' < wVar1) {
    wVar2 = wVar1;
  }
  panel_line(p,attr,"Overweight","%d.%d lb",(long)wVar1 / -10 & 0xffffffff,(ulong)(uint)wVar2 % 10);
  if (player->max_depth == 0) {
    puVar3 = "Town";
  }
  else {
    puVar3 = show_depth_buffer;
    strnfmt(show_depth_buffer,0xd,"%d\' (L%d)",(ulong)(uint)(player->max_depth * 0x32));
  }
  panel_line(p,'\r',"Max Depth","%s",puVar3);
  return p;
}

Assistant:

static struct panel *get_panel_midleft(void) {
	struct panel *p = panel_allocate(9);
	int diff = weight_remaining(player);
	uint8_t attr = diff < 0 ? COLOUR_L_RED : COLOUR_L_GREEN;

	panel_line(p, max_color(player->lev, player->max_lev),
			"Level", "%d", player->lev);
	panel_line(p, max_color(player->exp, player->max_exp),
			"Cur Exp", "%d", player->exp);
	panel_line(p, COLOUR_L_GREEN, "Max Exp", "%d", player->max_exp);
	panel_line(p, COLOUR_L_GREEN, "Adv Exp", "%s", show_adv_exp());
	panel_space(p);
	panel_line(p, COLOUR_L_GREEN, "Gold", "%d", player->au);
	panel_line(p, attr, "Burden", "%.1f lb",
			   player->upkeep->total_weight / 10.0F);
	panel_line(p, attr, "Overweight", "%d.%d lb", -diff / 10, abs(diff) % 10);
	panel_line(p, COLOUR_L_GREEN, "Max Depth", "%s", show_depth());

	return p;
}